

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::setUseSparse(Result *__return_storage_ptr__,OneHotEncoder *this,bool state)

{
  OneHotEncoder *pOVar1;
  
  pOVar1 = Specification::Model::_internal_mutable_onehotencoder
                     ((this->super_Model).m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  pOVar1->outputsparse_ = state;
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setUseSparse(bool state) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->set_outputsparse(state);
        return Result();
    }